

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

uint8_t __thiscall AmpIO::GetDigitalOutput(AmpIO *this)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(this->ReadBuffer[2] >> 0xc & 0xf) ^ 0xf;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 5) {
    uVar3 = (ulong)BitReverse4[uVar3];
  }
  bVar1 = (byte)uVar3;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x44514c41) {
    bVar1 = ~*(byte *)((long)this->ReadBuffer + 0xb) & 0xf0 | bVar1;
  }
  return bVar1;
}

Assistant:

uint8_t AmpIO::GetDigitalOutput(void) const
{
    // Starting with Version 1.3.0 of this library, the digital outputs are inverted
    // before being returned to the caller because they are inverted in hardware and/or firmware.
    // This way, the digital output state matches the hardware state (i.e., 0 means digital output
    // is at 0V).
    uint8_t dout = static_cast<uint8_t>((~(ReadBuffer[DIGIO_OFFSET]>>12))&0x0000000f);

    // Firmware versions < 5 have bits in reverse order with respect to schematic
    if (GetFirmwareVersion() < 5)
        dout = BitReverse4[dout];

    if (GetHardwareVersion() == DQLA_String) {
        dout |= static_cast<uint8_t>((~(ReadBuffer[DIGIO_OFFSET]>>24))&0x000000f0);
    }
    return dout;
}